

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_cas2_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint addr_in;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar1 = m68k_read_memory_32(uVar7 & m68ki_cpu.address_mask);
  uVar8 = uVar1 >> 0x10 & 7;
  uVar7 = m68ki_cpu.dar[uVar1 >> 0x1c];
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = uVar7;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar7);
  }
  uVar3 = m68k_read_memory_32(uVar2 & m68ki_cpu.address_mask);
  uVar2 = m68ki_cpu.dar[uVar8];
  uVar9 = uVar3 - uVar2;
  addr_in = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 10 & 0x3c));
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar4 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar4 = pmmu_translate_addr(addr_in);
  }
  uVar5 = m68k_read_memory_32(uVar4 & m68ki_cpu.address_mask);
  m68ki_cpu.n_flag = uVar9 >> 0x18;
  uVar6 = m68ki_cpu.dar[uVar8];
  m68ki_cpu.v_flag = ((uVar9 ^ uVar3) & (uVar6 ^ uVar3)) >> 0x18;
  m68ki_cpu.c_flag = ((uVar6 | uVar9) & ~uVar3 | uVar6 & uVar9) >> 0x17;
  m68ki_cpu.not_z_flag = uVar9;
  if (uVar3 == uVar2) {
    uVar9 = m68ki_cpu.dar[uVar1 & 7];
    uVar6 = uVar5 - uVar9;
    m68ki_cpu.n_flag = uVar6 >> 0x18;
    m68ki_cpu.v_flag = ((uVar6 ^ uVar5) & (uVar9 ^ uVar5)) >> 0x18;
    m68ki_cpu.c_flag = ((uVar6 | uVar9) & ~uVar5 | uVar6 & uVar9) >> 0x17;
    m68ki_cpu.not_z_flag = uVar5 - uVar9;
    if (m68ki_cpu.not_z_flag == 0) {
      m68ki_remaining_cycles = m68ki_remaining_cycles + -3;
      uVar8 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 0x14 & 0x1c));
      my_fc_handler(m68ki_cpu.s_flag | 1);
      if (m68ki_cpu.pmmu_enabled != 0) {
        uVar7 = pmmu_translate_addr(uVar7);
      }
      m68k_write_memory_32(uVar7 & m68ki_cpu.address_mask,uVar8);
      uVar1 = *(uint *)((long)m68ki_cpu.dar + (ulong)(uVar1 >> 4 & 0x1c));
      my_fc_handler(m68ki_cpu.s_flag | 1);
      if (m68ki_cpu.pmmu_enabled != 0) {
        addr_in = pmmu_translate_addr(addr_in);
      }
      m68k_write_memory_32(addr_in & m68ki_cpu.address_mask,uVar1);
      return;
    }
  }
  m68ki_cpu.dar[uVar8] = uVar3;
  m68ki_cpu.dar[uVar1 & 7] = uVar5;
  return;
}

Assistant:

static void m68k_op_cas2_32(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_32();
		uint* compare1 = &REG_D[(word2 >> 16) & 7];
		uint ea1 = REG_DA[(word2 >> 28) & 15];
		uint dest1 = m68ki_read_32(ea1);
		uint res1 = dest1 - *compare1;
		uint* compare2 = &REG_D[word2 & 7];
		uint ea2 = REG_DA[(word2 >> 12) & 15];
		uint dest2 = m68ki_read_32(ea2);
		uint res2;

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		FLAG_N = NFLAG_32(res1);
		FLAG_Z = MASK_OUT_ABOVE_32(res1);
		FLAG_V = VFLAG_SUB_32(*compare1, dest1, res1);
		FLAG_C = CFLAG_SUB_32(*compare1, dest1, res1);

		if(COND_EQ())
		{
			res2 = dest2 - *compare2;

			FLAG_N = NFLAG_32(res2);
			FLAG_Z = MASK_OUT_ABOVE_32(res2);
			FLAG_V = VFLAG_SUB_32(*compare2, dest2, res2);
			FLAG_C = CFLAG_SUB_32(*compare2, dest2, res2);

			if(COND_EQ())
			{
				USE_CYCLES(3);
				m68ki_write_32(ea1, REG_D[(word2 >> 22) & 7]);
				m68ki_write_32(ea2, REG_D[(word2 >> 6) & 7]);
				return;
			}
		}
		*compare1 = dest1;
		*compare2 = dest2;
		return;
	}
	m68ki_exception_illegal();
}